

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_subexp.h
# Opt level: O2

assignable_ptr_matrix<float> * __thiscall
dlib::assignable_ptr_matrix<float>::operator=
          (assignable_ptr_matrix<float> *this,
          matrix_exp<dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
          *exp)

{
  bool bVar1;
  undefined1 local_38 [24];
  other local_20;
  
  local_38._0_8_ = this->ptr;
  local_38._8_8_ = this->height;
  local_38._16_8_ = this->width;
  local_20._vptr_memory_manager_stateless_kernel_1 = (_func_int **)vpextrq_avx(local_38._8_16_,1);
  bVar1 = op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>>
          ::destructively_aliases<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>
                    ((op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>
                      *)exp,(matrix_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_> *)
                            local_38);
  if (bVar1) {
    matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>::
    matrix<dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>
              ((matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>
                *)local_38,exp);
    matrix_assign_default<dlib::assignable_ptr_matrix<float>,dlib::matrix_exp<dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>>
              (this,(matrix_exp<dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>
                     *)local_38);
    row_major_layout::layout<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_5>::
    ~layout((layout<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_5> *)local_38);
  }
  else {
    matrix_assign_default<dlib::assignable_ptr_matrix<float>,dlib::matrix_exp<dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>>
              (this,exp);
  }
  return this;
}

Assistant:

assignable_ptr_matrix& operator= (
            const matrix_exp<EXP>& exp
        ) 
        {
            // You can only assign to a set_ptrm() expression with a source matrix that
            // contains the same type of elements as the target (i.e. you can't mix double
            // and float types).
            COMPILE_TIME_ASSERT((is_same_type<T, typename EXP::type>::value == true));

            DLIB_ASSERT( exp.nr() == height && exp.nc() == width,
                "\tassignable_matrix_expression set_ptrm()"
                << "\n\tYou have tried to assign to this object using a matrix that isn't the right size"
                << "\n\texp.nr() (source matrix): " << exp.nr()
                << "\n\texp.nc() (source matrix): " << exp.nc() 
                << "\n\twidth (target matrix):    " << width
                << "\n\theight (target matrix):   " << height
                );

            if (exp.destructively_aliases(mat(ptr,height,width)) == false)
            {
                matrix_assign(*this, exp); 
            }
            else
            {
                // make a temporary copy of the matrix we are going to assign to ptr to 
                // avoid aliasing issues during the copy
                this->operator=(tmp(exp));
            }

            return *this;
        }